

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::runInvariants
          (Interpreter *this,LocationRange *loc,HeapObject *self)

{
  Stack *this_00;
  pointer pFVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer ppHVar4;
  HeapThunk *context;
  bool bVar5;
  LocationRange *args_1;
  uint counter;
  uint local_74;
  LocationRange local_70;
  
  this_00 = &this->stack;
  bVar5 = Stack::alreadyExecutingInvariants(this_00,self);
  if (!bVar5) {
    local_74 = 0;
    pFVar1 = (this->stack).stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar2 = (this->stack).stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    LocationRange::LocationRange(&local_70,loc);
    (anonymous_namespace)::Stack::
    newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::LocationRange>
              ((Stack *)this_00,(FrameKind)&local_70,args_1);
    std::__cxx11::string::~string((string *)&local_70);
    pFVar3 = (this->stack).stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    objectInvariants(this,self,self,&local_74,&pFVar3[-1].thunks);
    ppHVar4 = pFVar3[-1].thunks.
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pFVar3[-1].thunks.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppHVar4) {
      Stack::pop(this_00);
    }
    else {
      context = *ppHVar4;
      pFVar3 = (this->stack).stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar3[-1].elementId = 1;
      pFVar3[-1].self = self;
      Stack::newCall(this_00,loc,&context->super_HeapEntity,context->self,context->offset,
                     &context->upValues);
      evaluate(this,context->body,(uint)(((long)pFVar1 - (long)pFVar2) / 400));
    }
  }
  return;
}

Assistant:

void runInvariants(const LocationRange &loc, HeapObject *self)
    {
        if (stack.alreadyExecutingInvariants(self))
            return;

        unsigned counter = 0;
        unsigned initial_stack_size = stack.size();
        stack.newFrame(FRAME_INVARIANTS, loc);
        std::vector<HeapThunk *> &thunks = stack.top().thunks;
        objectInvariants(self, self, counter, thunks);
        if (thunks.size() == 0) {
            stack.pop();
            return;
        }
        HeapThunk *thunk = thunks[0];
        stack.top().elementId = 1;
        stack.top().self = self;
        stack.newCall(loc, thunk, thunk->self, thunk->offset, thunk->upValues);
        evaluate(thunk->body, initial_stack_size);
    }